

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Vgm_Emu::start_track_(Vgm_Emu *this,int track)

{
  bool bVar1;
  uint entire_buffer;
  blargg_ulong bVar2;
  header_t *phVar3;
  Vgm_Emu *in_RDI;
  long data_offset;
  blargg_err_t blargg_return_err_;
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  Sms_Apu *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  blargg_err_t local_8;
  
  local_8 = Classic_Emu::start_track_
                      ((Classic_Emu *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (local_8 == (blargg_err_t)0x0) {
    this_00 = &(in_RDI->super_Vgm_Emu_Impl).psg;
    phVar3 = header(in_RDI);
    entire_buffer = get_le16(phVar3->noise_feedback);
    header(in_RDI);
    Sms_Apu::reset(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    (in_RDI->super_Vgm_Emu_Impl).dac_disabled = -1;
    (in_RDI->super_Vgm_Emu_Impl).pos = (in_RDI->super_Vgm_Emu_Impl).data + 0x40;
    (in_RDI->super_Vgm_Emu_Impl).pcm_data = (in_RDI->super_Vgm_Emu_Impl).pos;
    (in_RDI->super_Vgm_Emu_Impl).pcm_pos = (in_RDI->super_Vgm_Emu_Impl).pos;
    (in_RDI->super_Vgm_Emu_Impl).dac_amp = -1;
    (in_RDI->super_Vgm_Emu_Impl).vgm_time = 0;
    phVar3 = header(in_RDI);
    bVar2 = get_le32(phVar3->version);
    if (0x14f < bVar2) {
      phVar3 = header(in_RDI);
      bVar2 = get_le32(phVar3->data_offset);
      if ((ulong)bVar2 != 0) {
        (in_RDI->super_Vgm_Emu_Impl).pos = (in_RDI->super_Vgm_Emu_Impl).pos + ((ulong)bVar2 - 0xc);
      }
    }
    if ((in_RDI->uses_fm & 1U) != 0) {
      bVar1 = Ym_Emu<Ym2413_Emu>::enabled(&(in_RDI->super_Vgm_Emu_Impl).ym2413);
      if (bVar1) {
        Ym2413_Emu::reset(&(in_RDI->super_Vgm_Emu_Impl).ym2413.super_Ym2413_Emu);
      }
      bVar1 = Ym_Emu<Ym2612_Emu>::enabled(&(in_RDI->super_Vgm_Emu_Impl).ym2612);
      if (bVar1) {
        Ym2612_Emu::reset((Ym2612_Emu *)0x80bba9);
      }
      (in_RDI->super_Vgm_Emu_Impl).fm_time_offset = 0;
      Blip_Buffer::clear((Blip_Buffer *)in_RDI,entire_buffer);
      Dual_Resampler::clear((Dual_Resampler *)0x80bbdb);
    }
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t Vgm_Emu::start_track_( int track )
{
	RETURN_ERR( Classic_Emu::start_track_( track ) );
	psg.reset( get_le16( header().noise_feedback ), header().noise_width );
	
	dac_disabled = -1;
	pos          = data + header_size;
	pcm_data     = pos;
	pcm_pos      = pos;
	dac_amp      = -1;
	vgm_time     = 0;
	if ( get_le32( header().version ) >= 0x150 )
	{
		long data_offset = get_le32( header().data_offset );
		check( data_offset );
		if ( data_offset )
			pos += data_offset + offsetof (header_t,data_offset) - 0x40;
	}
	
	if ( uses_fm )
	{
		if ( ym2413.enabled() )
			ym2413.reset();
		
		if ( ym2612.enabled() )
			ym2612.reset();
		
		fm_time_offset = 0;
		blip_buf.clear();
		Dual_Resampler::clear();
	}
	return 0;
}